

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O3

void __thiscall
dap::BasicTypeInfo<dap::ColumnDescriptor>::destruct
          (BasicTypeInfo<dap::ColumnDescriptor> *this,void *ptr)

{
  if (*(long **)((long)ptr + 0x68) != (long *)((long)ptr + 0x78)) {
    operator_delete(*(long **)((long)ptr + 0x68),*(long *)((long)ptr + 0x78) + 1);
  }
  if (*(long **)((long)ptr + 0x48) != (long *)((long)ptr + 0x58)) {
    operator_delete(*(long **)((long)ptr + 0x48),*(long *)((long)ptr + 0x58) + 1);
  }
  if (*(long **)((long)ptr + 0x20) != (long *)((long)ptr + 0x30)) {
    operator_delete(*(long **)((long)ptr + 0x20),*(long *)((long)ptr + 0x30) + 1);
  }
  if (*ptr != (long *)((long)ptr + 0x10)) {
    operator_delete(*ptr,*(long *)((long)ptr + 0x10) + 1);
    return;
  }
  return;
}

Assistant:

inline void destruct(void* ptr) const override {
    reinterpret_cast<T*>(ptr)->~T();
  }